

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

SDL12_CDstatus SDL_CDStatus(SDL12_CD *cdrom)

{
  int iVar1;
  AudioCallbackWrapperData *pAVar2;
  SDL12_CDstatus SVar3;
  char *pcVar4;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0)) {
      (*SDL20_LockAudio)();
      pAVar2 = audio_cbdata;
      if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
        SVar3 = cdrom->status;
      }
      else {
        SVar3 = audio_cbdata->cdrom_status;
        cdrom->status = SVar3;
        iVar1 = pAVar2->cdrom_cur_frame;
        cdrom->cur_track = pAVar2->cdrom_cur_track;
        cdrom->cur_frame = iVar1;
      }
      (*SDL20_UnlockAudio)();
      return SVar3;
    }
    pcVar4 = "CD-ROM not opened";
  }
  else {
    pcVar4 = "CD-ROM subsystem not initialized";
  }
  (*SDL20_SetError)(pcVar4);
  return SDL12_CD_ERROR;
}

Assistant:

SDLCALL
SDL_CDStatus(SDL12_CD *cdrom)
{
    SDL12_CDstatus retval;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return SDL12_CD_ERROR;
    }

    SDL20_LockAudio();  /* we update this during the audio callback. */
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status;
        cdrom->cur_track = audio_cbdata->cdrom_cur_track;
        cdrom->cur_frame = audio_cbdata->cdrom_cur_frame;
    }
    retval = cdrom->status;
    SDL20_UnlockAudio();

    return retval;
}